

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkField
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  int number;
  string *psVar1;
  bool bVar2;
  Type TVar3;
  FieldOptions *pFVar4;
  FieldDescriptor *pFVar5;
  PlaceholderType placeholder_type;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar6;
  SubstituteArg *this_00;
  Symbol SVar7;
  ulong uVar8;
  _Alloc_hider in_stack_fffffffffffffdc8;
  SubstituteArg local_200;
  string local_1d0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  this_00 = (SubstituteArg *)&stack0xfffffffffffffdc8;
  if (*(long *)(field + 0x60) == 0) {
    pFVar4 = FieldOptions::default_instance();
    *(FieldOptions **)(field + 0x60) = pFVar4;
  }
  if ((proto->_has_bits_[0] & 0x20) != 0) {
    SVar7 = LookupSymbol(this,proto->extendee_,*(string **)(field + 8),
                         PLACEHOLDER_EXTENDABLE_MESSAGE,LOOKUP_ALL);
    aVar6 = SVar7.field_1;
    if (SVar7.type != MESSAGE) {
      if (SVar7.type == NULL_SYMBOL) {
        AddNotDefinedError(this,*(string **)(field + 8),&proto->super_Message,EXTENDEE,
                           proto->extendee_);
        return;
      }
      psVar1 = *(string **)(field + 8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_200
                     ,"\"",proto->extendee_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffdc8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_200
                     ,"\" is not a message type.");
      AddError(this,psVar1,&proto->super_Message,EXTENDEE,(string *)&stack0xfffffffffffffdc8);
      goto LAB_001e5440;
    }
    ((anon_union_8_7_bfa3a334_for_Symbol_2 *)(field + 0x38))->descriptor = (Descriptor *)aVar6;
    number = *(int *)(field + 0x28);
    bVar2 = Descriptor::IsExtensionNumber(aVar6.descriptor,number);
    if (!bVar2) {
      psVar1 = *(string **)(field + 8);
      in_stack_fffffffffffffdc8._M_p = (pointer)**(undefined8 **)(aVar6.descriptor + 8);
      strings::internal::SubstituteArg::SubstituteArg(&local_200,number);
      local_1b0.text_ = (char *)0x0;
      local_1b0.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&local_1d0,(strings *)"\"$0\" does not declare $1 as an extension number.",
                 &stack0xfffffffffffffdc8,&local_200,&local_1b0,&local_180,&local_60,&local_90,
                 &local_c0,&local_f0,&local_120,&local_150,
                 (SubstituteArg *)in_stack_fffffffffffffdc8._M_p);
      AddError(this,psVar1,&proto->super_Message,NUMBER,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
    }
  }
  if ((proto->_has_bits_[0] & 0x10) == 0) {
    if ((*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) | 2) !=
        10) goto LAB_001e552c;
    psVar1 = *(string **)(field + 8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xfffffffffffffdc8,
               "Field with message or enum type missing type_name.",(allocator<char> *)&local_200);
    AddError(this,psVar1,&proto->super_Message,TYPE,(string *)&stack0xfffffffffffffdc8);
    this_00 = (SubstituteArg *)&stack0xfffffffffffffdc8;
  }
  else {
    placeholder_type = proto->_has_bits_[0] >> 6 & PLACEHOLDER_ENUM;
    if (proto->type_ == 0xe) {
      placeholder_type = PLACEHOLDER_ENUM;
    }
    SVar7 = LookupSymbol(this,proto->type_name_,*(string **)(field + 8),placeholder_type,
                         LOOKUP_TYPES);
    aVar6 = SVar7.field_1;
    TVar3 = SVar7.type;
    if (TVar3 == NULL_SYMBOL) {
      AddNotDefinedError(this,*(string **)(field + 8),&proto->super_Message,TYPE,proto->type_name_);
      return;
    }
    if ((proto->_has_bits_[0] & 8) == 0) {
      if (TVar3 == ENUM) {
        *(undefined4 *)(field + 0x2c) = 0xe;
        uVar8 = 0xe;
      }
      else {
        if (TVar3 != MESSAGE) {
          psVar1 = *(string **)(field + 8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_200,"\"",proto->type_name_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xfffffffffffffdc8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_200,"\" is not a type.");
          AddError(this,psVar1,&proto->super_Message,TYPE,(string *)&stack0xfffffffffffffdc8);
          goto LAB_001e5440;
        }
        *(undefined4 *)(field + 0x2c) = 0xb;
        uVar8 = 0xb;
      }
    }
    else {
      uVar8 = (ulong)*(uint *)(field + 0x2c);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + uVar8 * 4) == 8) {
      if (TVar3 != ENUM) {
        psVar1 = *(string **)(field + 8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_200,"\"",proto->type_name_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffffdc8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_200,"\" is not an enum type.");
        AddError(this,psVar1,&proto->super_Message,TYPE,(string *)&stack0xfffffffffffffdc8);
LAB_001e5440:
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc8);
        std::__cxx11::string::~string((string *)&local_200);
        return;
      }
      ((anon_union_8_7_bfa3a334_for_Symbol_2 *)(field + 0x50))->descriptor = (Descriptor *)aVar6;
      if (aVar6.descriptor[0x28] == (Descriptor)0x1) {
        field[0x68] = (FieldDescriptor)0x0;
      }
      else if (((byte)field[0x68] & 1) != 0) {
        SVar7 = LookupSymbolNoPlaceholder
                          (this,proto->default_value_,*(string **)(aVar6.descriptor + 8),LOOKUP_ALL)
        ;
        if ((SVar7.type == ENUM_VALUE) &&
           (*(long *)(SVar7.field_1.descriptor + 0x18) == *(long *)(field + 0x50))) {
          ((anon_union_8_7_bfa3a334_for_Symbol_2 *)(field + 0x70))->descriptor =
               (Descriptor *)SVar7.field_1;
          goto LAB_001e552c;
        }
        psVar1 = *(string **)(field + 8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_180,"Enum type \"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (*(long *)(field + 0x50) + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_180,"\" has no value named \"");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_200,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1b0,proto->default_value_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffffdc8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_200,"\".");
        AddError(this,psVar1,&proto->super_Message,DEFAULT_VALUE,(string *)&stack0xfffffffffffffdc8)
        ;
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc8);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)&local_1b0);
        this_00 = &local_180;
        goto LAB_001e5527;
      }
      if (0 < *(int *)(aVar6.descriptor + 0x2c)) {
        *(undefined8 *)(field + 0x70) = *(undefined8 *)(aVar6.descriptor + 0x30);
      }
      goto LAB_001e552c;
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + uVar8 * 4) == 10) {
      if (TVar3 != MESSAGE) {
        psVar1 = *(string **)(field + 8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_200,"\"",proto->type_name_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffffdc8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_200,"\" is not a message type.");
        AddError(this,psVar1,&proto->super_Message,TYPE,(string *)&stack0xfffffffffffffdc8);
        goto LAB_001e5440;
      }
      ((anon_union_8_7_bfa3a334_for_Symbol_2 *)(field + 0x48))->descriptor = (Descriptor *)aVar6;
      if (field[0x68] != (FieldDescriptor)0x1) goto LAB_001e552c;
      psVar1 = *(string **)(field + 8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xfffffffffffffdc8,"Messages can\'t have default values.",
                 (allocator<char> *)&local_200);
      AddError(this,psVar1,&proto->super_Message,DEFAULT_VALUE,(string *)&stack0xfffffffffffffdc8);
      this_00 = (SubstituteArg *)&stack0xfffffffffffffdc8;
    }
    else {
      psVar1 = *(string **)(field + 8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xfffffffffffffdc8,"Field with primitive type has type_name.",
                 (allocator<char> *)&local_200);
      AddError(this,psVar1,&proto->super_Message,TYPE,(string *)&stack0xfffffffffffffdc8);
    }
  }
LAB_001e5527:
  std::__cxx11::string::~string((string *)this_00);
LAB_001e552c:
  bVar2 = FileDescriptorTables::AddFieldByNumber(this->file_tables_,field);
  if (!bVar2) {
    pFVar5 = FileDescriptorTables::FindFieldByNumber
                       (this->file_tables_,*(Descriptor **)(field + 0x38),*(int *)(field + 0x28));
    psVar1 = *(string **)(field + 8);
    if (field[0x34] == (FieldDescriptor)0x1) {
      strings::internal::SubstituteArg::SubstituteArg
                ((SubstituteArg *)&stack0xfffffffffffffdc8,*(int *)(field + 0x28));
      local_200.text_ = (char *)**(undefined8 **)(*(long *)(field + 0x38) + 8);
      local_200.size_ = *(int *)(*(undefined8 **)(*(long *)(field + 0x38) + 8) + 1);
      local_1b0.text_ = (char *)**(undefined8 **)(pFVar5 + 8);
      local_1b0.size_ = *(int *)(*(undefined8 **)(pFVar5 + 8) + 1);
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&local_1d0,
                 (strings *)
                 "Extension number $0 has already been used in \"$1\" by extension \"$2\".",
                 &stack0xfffffffffffffdc8,&local_200,&local_1b0,&local_180,&local_60,&local_90,
                 &local_c0,&local_f0,&local_120,&local_150,
                 (SubstituteArg *)in_stack_fffffffffffffdc8._M_p);
      AddError(this,psVar1,&proto->super_Message,NUMBER,&local_1d0);
    }
    else {
      strings::internal::SubstituteArg::SubstituteArg
                ((SubstituteArg *)&stack0xfffffffffffffdc8,*(int *)(field + 0x28));
      local_200.text_ = (char *)**(undefined8 **)(*(long *)(field + 0x38) + 8);
      local_200.size_ = *(int *)(*(undefined8 **)(*(long *)(field + 0x38) + 8) + 1);
      local_1b0.text_ = (char *)**(undefined8 **)pFVar5;
      local_1b0.size_ = *(int *)(*(undefined8 **)pFVar5 + 1);
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&local_1d0,
                 (strings *)"Field number $0 has already been used in \"$1\" by field \"$2\".",
                 &stack0xfffffffffffffdc8,&local_200,&local_1b0,&local_180,&local_60,&local_90,
                 &local_c0,&local_f0,&local_120,&local_150,
                 (SubstituteArg *)in_stack_fffffffffffffdc8._M_p);
      AddError(this,psVar1,&proto->super_Message,NUMBER,&local_1d0);
    }
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    DescriptorPool::Tables::AddExtension(this->tables_,field);
  }
  FileDescriptorTables::AddFieldByStylizedNames(this->file_tables_,field);
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkField(
    FieldDescriptor* field, const FieldDescriptorProto& proto) {
  if (field->options_ == NULL) {
    field->options_ = &FieldOptions::default_instance();
  }

  if (proto.has_extendee()) {
    Symbol extendee = LookupSymbol(proto.extendee(), field->full_name(),
                                   PLACEHOLDER_EXTENDABLE_MESSAGE);
    if (extendee.IsNull()) {
      AddNotDefinedError(field->full_name(), proto,
                         DescriptorPool::ErrorCollector::EXTENDEE,
                         proto.extendee());
      return;
    } else if (extendee.type != Symbol::MESSAGE) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "\"" + proto.extendee() + "\" is not a message type.");
      return;
    }
    field->containing_type_ = extendee.descriptor;

    if (!field->containing_type()->IsExtensionNumber(field->number())) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("\"$0\" does not declare $1 as an "
                                   "extension number.",
                                   field->containing_type()->full_name(),
                                   field->number()));
    }
  }

  if (proto.has_type_name()) {
    // Assume we are expecting a message type unless the proto contains some
    // evidence that it expects an enum type.  This only makes a difference if
    // we end up creating a placeholder.
    bool expecting_enum = (proto.type() == FieldDescriptorProto::TYPE_ENUM) ||
                          proto.has_default_value();

    Symbol type =
      LookupSymbol(proto.type_name(), field->full_name(),
                   expecting_enum ? PLACEHOLDER_ENUM : PLACEHOLDER_MESSAGE,
                   LOOKUP_TYPES);

    if (type.IsNull()) {
      AddNotDefinedError(field->full_name(), proto,
                         DescriptorPool::ErrorCollector::TYPE,
                         proto.type_name());
      return;
    }

    if (!proto.has_type()) {
      // Choose field type based on symbol.
      if (type.type == Symbol::MESSAGE) {
        field->type_ = FieldDescriptor::TYPE_MESSAGE;
      } else if (type.type == Symbol::ENUM) {
        field->type_ = FieldDescriptor::TYPE_ENUM;
      } else {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not a type.");
        return;
      }
    }

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (type.type != Symbol::MESSAGE) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not a message type.");
        return;
      }
      field->message_type_ = type.descriptor;

      if (field->has_default_value()) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                 "Messages can't have default values.");
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      if (type.type != Symbol::ENUM) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not an enum type.");
        return;
      }
      field->enum_type_ = type.enum_descriptor;

      if (field->enum_type()->is_placeholder_) {
        // We can't look up default values for placeholder types.  We'll have
        // to just drop them.
        field->has_default_value_ = false;
      }

      if (field->has_default_value()) {
        // We can't just use field->enum_type()->FindValueByName() here
        // because that locks the pool's mutex, which we have already locked
        // at this point.
        Symbol default_value =
          LookupSymbolNoPlaceholder(proto.default_value(),
                                    field->enum_type()->full_name());

        if (default_value.type == Symbol::ENUM_VALUE &&
            default_value.enum_value_descriptor->type() == field->enum_type()) {
          field->default_value_enum_ = default_value.enum_value_descriptor;
        } else {
          AddError(field->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Enum type \"" + field->enum_type()->full_name() +
                   "\" has no value named \"" + proto.default_value() + "\".");
        }
      } else if (field->enum_type()->value_count() > 0) {
        // All enums must have at least one value, or we would have reported
        // an error elsewhere.  We use the first defined value as the default
        // if a default is not explicitly defined.
        field->default_value_enum_ = field->enum_type()->value(0);
      }
    } else {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Field with primitive type has type_name.");
    }
  } else {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
        field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Field with message or enum type missing type_name.");
    }
  }

  // Add the field to the fields-by-number table.
  // Note:  We have to do this *after* cross-linking because extensions do not
  //   know their containing type until now.
  if (!file_tables_->AddFieldByNumber(field)) {
    const FieldDescriptor* conflicting_field =
      file_tables_->FindFieldByNumber(field->containing_type(),
                                      field->number());
    if (field->is_extension()) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("Extension number $0 has already been used "
                                   "in \"$1\" by extension \"$2\".",
                                   field->number(),
                                   field->containing_type()->full_name(),
                                   conflicting_field->full_name()));
    } else {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("Field number $0 has already been used in "
                                   "\"$1\" by field \"$2\".",
                                   field->number(),
                                   field->containing_type()->full_name(),
                                   conflicting_field->name()));
    }
  }

  if (field->is_extension()) {
    // No need for error checking: if the extension number collided,
    // we've already been informed of it by the if() above.
    tables_->AddExtension(field);
  }

  // Add the field to the lowercase-name and camelcase-name tables.
  file_tables_->AddFieldByStylizedNames(field);
}